

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCollapsingSortedStoragesList.hpp
# Opt level: O0

optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_> * __thiscall
supermap::
BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>
::find(BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>
       *this,Key<1UL> *pattern,
      function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_&,_const_supermap::Key<1UL>_&)>
      *less,function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_&,_const_supermap::Key<1UL>_&)>
            *equal)

{
  bool bVar1;
  function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_&,_const_supermap::Key<1UL>_&)>
  *in_RCX;
  shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>::ListNode>
  *in_RDX;
  optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_> *in_RDI;
  function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_&,_const_supermap::Key<1UL>_&)>
  *in_R8;
  shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>::ListNode>
  curNode;
  pointer in_stack_ffffffffffffff48;
  shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>::ListNode>
  *in_stack_ffffffffffffff50;
  undefined1 local_80 [48];
  undefined1 local_50 [64];
  shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>::ListNode>
  *local_10;
  
  local_10 = in_RDX;
  std::
  shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>::ListNode>
  ::shared_ptr(in_stack_ffffffffffffff50,
               (shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>::ListNode>
                *)in_stack_ffffffffffffff48);
  while (bVar1 = std::operator!=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48), bVar1) {
    std::
    __shared_ptr_access<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x23b8eb);
    in_stack_ffffffffffffff48 =
         std::
         unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>
         ::operator->((unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>
                       *)0x23b8f3);
    in_stack_ffffffffffffff50 = local_10;
    std::
    function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_&,_const_supermap::Key<1UL>_&)>
    ::function(in_RCX,in_R8);
    std::
    function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_&,_const_supermap::Key<1UL>_&)>
    ::function(in_RCX,in_R8);
    (*(in_stack_ffffffffffffff48->
      super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
      ).
      super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
      .
      super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
      ._vptr_OrderedStorage[6])
              (in_RDI,in_stack_ffffffffffffff48,in_stack_ffffffffffffff50,local_50,local_80);
    std::
    function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_&,_const_supermap::Key<1UL>_&)>
    ::~function((function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_&,_const_supermap::Key<1UL>_&)>
                 *)0x23b953);
    std::
    function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_&,_const_supermap::Key<1UL>_&)>
    ::~function((function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_&,_const_supermap::Key<1UL>_&)>
                 *)0x23b95d);
    bVar1 = std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>::has_value
                      ((optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_> *)0x23b967)
    ;
    if (bVar1) goto LAB_0023b9f6;
    std::
    __shared_ptr_access<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x23b9cb);
    std::
    shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>::ListNode>
    ::operator=(in_stack_ffffffffffffff50,
                (shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>::ListNode>
                 *)in_stack_ffffffffffffff48);
  }
  std::optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_>::optional(in_RDI);
LAB_0023b9f6:
  std::
  shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>::ListNode>
  ::~shared_ptr((shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>::ListNode>
                 *)0x23ba03);
  return in_RDI;
}

Assistant:

std::optional<T> find(
        const FindPatternType &pattern,
        std::function<bool(const T &, const FindPatternType &)> less,
        std::function<bool(const T &, const FindPatternType &)> equal
    ) override {
        std::shared_ptr<ListNode> curNode = head_;
        while (curNode != nullptr) {
            assert(curNode->valid());
            std::optional<T> found = curNode->storage->find(pattern, less, equal);
            if (found.has_value()) {
                return found;
            }
            curNode = curNode->next;
        }
        return std::nullopt;
    }